

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashdict.c
# Opt level: O2

dictionary * dic_new(int initial_size)

{
  int iVar1;
  dictionary *pdVar2;
  keynode **ppkVar3;
  
  pdVar2 = (dictionary *)malloc(0x28);
  iVar1 = 0x400;
  if (initial_size != 0) {
    iVar1 = initial_size;
  }
  pdVar2->length = iVar1;
  pdVar2->count = 0;
  ppkVar3 = (keynode **)calloc(8,(long)iVar1);
  pdVar2->table = ppkVar3;
  pdVar2->growth_treshold = 2.0;
  pdVar2->growth_factor = 10.0;
  return pdVar2;
}

Assistant:

struct dictionary* dic_new(int initial_size) {
	struct dictionary* dic = malloc(sizeof(struct dictionary));
	if (initial_size == 0) initial_size = 1024;
	dic->length = initial_size;
	dic->count = 0;
	dic->table = calloc(sizeof(struct keynode*), initial_size);
	dic->growth_treshold = 2.0;
	dic->growth_factor = 10;
	return dic;
}